

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

StringRef __thiscall llvm::Twine::toNullTerminatedStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  bool bVar1;
  NodeKind NVar2;
  char *data;
  pointer data_00;
  size_t sVar3;
  char local_31;
  Child local_30;
  string *str;
  SmallVectorImpl<char> *Out_local;
  Twine *this_local;
  
  str = (string *)Out;
  Out_local = (SmallVectorImpl<char> *)this;
  bVar1 = isUnary(this);
  if (bVar1) {
    NVar2 = getLHSKind(this);
    if (NVar2 == CStringKind) {
      StringRef::StringRef((StringRef *)&this_local,(this->LHS).cString);
      return _this_local;
    }
    if (NVar2 == StdStringKind) {
      local_30 = this->LHS;
      data = (char *)std::__cxx11::string::c_str();
      sVar3 = std::__cxx11::string::size();
      StringRef::StringRef((StringRef *)&this_local,data,sVar3);
      return _this_local;
    }
  }
  toVector(this,(SmallVectorImpl<char> *)str);
  local_31 = '\0';
  SmallVectorTemplateBase<char,_true>::push_back
            ((SmallVectorTemplateBase<char,_true> *)str,&local_31);
  SmallVectorTemplateBase<char,_true>::pop_back((SmallVectorTemplateBase<char,_true> *)str);
  data_00 = SmallVectorTemplateCommon<char,_void>::data
                      ((SmallVectorTemplateCommon<char,_void> *)str);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)str);
  StringRef::StringRef((StringRef *)&this_local,data_00,sVar3);
  return _this_local;
}

Assistant:

StringRef Twine::toNullTerminatedStringRef(SmallVectorImpl<char> &Out) const {
  if (isUnary()) {
    switch (getLHSKind()) {
    case CStringKind:
      // Already null terminated, yay!
      return StringRef(LHS.cString);
    case StdStringKind: {
      const std::string *str = LHS.stdString;
      return StringRef(str->c_str(), str->size());
    }
    default:
      break;
    }
  }
  toVector(Out);
  Out.push_back(0);
  Out.pop_back();
  return StringRef(Out.data(), Out.size());
}